

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmLinkImplementation * __thiscall
cmGeneratorTarget::GetLinkImplementation
          (cmGeneratorTarget *this,string *config,LinkInterfaceFor implFor,bool secondPass)

{
  bool bVar1;
  cmOptionalLinkImplementation *local_f8;
  cmOptionalLinkImplementation local_e8;
  cmGeneratorTarget *local_40;
  cmGeneratorTarget *local_38;
  cmOptionalLinkImplementation *impl;
  HeadToLinkImplementationMap *hm;
  bool secondPass_local;
  string *psStack_20;
  LinkInterfaceFor implFor_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  hm._3_1_ = secondPass;
  hm._4_4_ = implFor;
  psStack_20 = config;
  config_local = (string *)this;
  bVar1 = CanCompileSources(this);
  if (bVar1) {
    if (hm._4_4_ == Usage) {
      local_f8 = (cmOptionalLinkImplementation *)
                 GetHeadToLinkImplementationUsageRequirementsMap(this,psStack_20);
    }
    else {
      local_f8 = (cmOptionalLinkImplementation *)GetHeadToLinkImplementationMap(this,psStack_20);
    }
    impl = local_f8;
    local_40 = this;
    local_38 = (cmGeneratorTarget *)
               std::
               map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
               ::operator[]((map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
                             *)local_f8,&local_40);
    if ((hm._3_1_ & 1) != 0) {
      memset(&local_e8,0,0xa8);
      cmOptionalLinkImplementation::cmOptionalLinkImplementation(&local_e8);
      cmOptionalLinkImplementation::operator=((cmOptionalLinkImplementation *)local_38,&local_e8);
      cmOptionalLinkImplementation::~cmOptionalLinkImplementation(&local_e8);
    }
    if (((local_38->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0x100) ==
        _S_red) {
      *(byte *)((long)&(local_38->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_color + 1) = 1;
      ComputeLinkImplementationLibraries
                (this,psStack_20,(cmOptionalLinkImplementation *)local_38,this,hm._4_4_);
    }
    if (((local_38->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0x10000)
        == _S_red) {
      *(byte *)((long)&(local_38->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_color + 2) = 1;
      ComputeLinkImplementationLanguages(this,psStack_20,(cmOptionalLinkImplementation *)local_38);
      ComputeLinkImplementationRuntimeLibraries
                (this,psStack_20,(cmOptionalLinkImplementation *)local_38);
    }
    this_local = local_38;
  }
  else {
    this_local = (cmGeneratorTarget *)0x0;
  }
  return (cmLinkImplementation *)this_local;
}

Assistant:

const cmLinkImplementation* cmGeneratorTarget::GetLinkImplementation(
  const std::string& config, LinkInterfaceFor implFor, bool secondPass) const
{
  // There is no link implementation for targets that cannot compile sources.
  if (!this->CanCompileSources()) {
    return nullptr;
  }

  HeadToLinkImplementationMap& hm =
    (implFor == LinkInterfaceFor::Usage
       ? this->GetHeadToLinkImplementationUsageRequirementsMap(config)
       : this->GetHeadToLinkImplementationMap(config));
  cmOptionalLinkImplementation& impl = hm[this];
  if (secondPass) {
    impl = cmOptionalLinkImplementation();
  }
  if (!impl.LibrariesDone) {
    impl.LibrariesDone = true;
    this->ComputeLinkImplementationLibraries(config, impl, this, implFor);
  }
  if (!impl.LanguagesDone) {
    impl.LanguagesDone = true;
    this->ComputeLinkImplementationLanguages(config, impl);
    this->ComputeLinkImplementationRuntimeLibraries(config, impl);
  }
  return &impl;
}